

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O2

void __thiscall Planner::Planner(Planner *this,string *nume)

{
  this->_vptr_Planner = (_func_int **)&PTR__Planner_0010dcb0;
  std::__cxx11::string::string((string *)&this->nume,nume);
  (this->Backlogs).
  super__Vector_base<std::shared_ptr<Backlog>,_std::allocator<std::shared_ptr<Backlog>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Backlogs).
  super__Vector_base<std::shared_ptr<Backlog>,_std::allocator<std::shared_ptr<Backlog>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Liste).super__Vector_base<std::shared_ptr<Lista>,_std::allocator<std::shared_ptr<Lista>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Backlogs).
  super__Vector_base<std::shared_ptr<Backlog>,_std::allocator<std::shared_ptr<Backlog>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Liste).super__Vector_base<std::shared_ptr<Lista>,_std::allocator<std::shared_ptr<Lista>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Liste).super__Vector_base<std::shared_ptr<Lista>,_std::allocator<std::shared_ptr<Lista>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Planner::Planner(const std::string &nume) : nume(nume) {}